

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O1

void __thiscall
Assimp::PLYImporter::LoadMaterial
          (PLYImporter *this,vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *pvOut,
          string *defaultTexture,bool pointsOnly)

{
  ESemantic EVar1;
  pointer pPVar2;
  double dVar3;
  iterator iVar4;
  undefined1 auVar5 [16];
  string *psVar6;
  aiColor4D aVar7;
  undefined8 uVar8;
  undefined1 *puVar9;
  EDataType EVar10;
  DOM *pDVar11;
  aiMaterial *paVar12;
  runtime_error *prVar13;
  undefined7 in_register_00000009;
  ulong uVar14;
  char *pKey;
  pointer pPVar15;
  pointer pEVar16;
  ulong uVar17;
  uint uVar18;
  size_t sVar19;
  vector<aiMaterial*,std::allocator<aiMaterial*>> *pvVar20;
  uint uVar21;
  pointer pEVar22;
  EDataType EVar23;
  pointer avList;
  float fVar24;
  aiMaterial *pcHelper;
  int iMode;
  int two_sided;
  aiColor4D clrOut;
  ai_real fOpacity;
  aiMaterial *local_548;
  EDataType local_53c;
  uint local_538;
  EDataType local_534;
  undefined4 local_530;
  undefined4 local_52c;
  allocator local_525;
  uint local_524;
  uint local_520;
  uint local_51c;
  uint local_518;
  uint local_514;
  EDataType local_510;
  EDataType local_50c;
  EDataType local_508;
  EDataType local_504;
  EDataType local_500;
  EDataType local_4fc;
  EDataType local_4f8;
  EDataType local_4f4;
  EDataType local_4f0;
  undefined4 local_4ec;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [8];
  undefined8 uStack_4d0;
  undefined1 local_4c8 [8];
  undefined8 uStack_4c0;
  uint local_4b8;
  undefined4 uStack_4b4;
  uint uStack_4b0;
  uint uStack_4ac;
  uint local_4a8;
  uint uStack_4a4;
  uint uStack_4a0;
  uint uStack_49c;
  uint local_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  ulong local_488;
  vector<aiMaterial*,std::allocator<aiMaterial*>> *local_480;
  string *local_478;
  pointer local_470;
  aiColor4D local_468;
  undefined1 *local_458;
  ulong local_450;
  undefined1 local_448 [16];
  aiString local_438;
  
  local_530 = (undefined4)CONCAT71(in_register_00000009,pointsOnly);
  if (pvOut == (vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)0x0) {
    __assert_fail("__null != pvOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyLoader.cpp"
                  ,0x2d6,
                  "void Assimp::PLYImporter::LoadMaterial(std::vector<aiMaterial *> *, std::string &, const bool)"
                 );
  }
  local_498 = 0xffffffff;
  uStack_494 = 0xffffffff;
  uStack_490 = 0xffffffff;
  uStack_48c = 0xffffffff;
  local_4a8 = 0xffffffff;
  uStack_4a4 = 0xffffffff;
  uStack_4a0 = 0xffffffff;
  uStack_49c = 0xffffffff;
  local_4b8 = 0xffffffff;
  uStack_4b4 = 0xffffffff;
  uStack_4b0 = 0xffffffff;
  uStack_4ac = 0xffffffff;
  _local_4c8 = (undefined1  [16])0x0;
  _local_4d8 = (undefined1  [16])0x0;
  local_4e8 = (undefined1  [16])0x0;
  pDVar11 = this->pcDOM;
  pEVar16 = (pDVar11->alElements).
            super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_538 = 0xffffffff;
  local_53c._0_1_ = '\x01';
  local_480 = (vector<aiMaterial*,std::allocator<aiMaterial*>> *)pvOut;
  local_478 = defaultTexture;
  if (pEVar16 ==
      (pDVar11->alElements).
      super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar14 = 0;
    EVar23 = EDT_Char;
    pEVar22 = (pointer)0x0;
  }
  else {
    uVar18 = 0;
    do {
      if (pEVar16->eSemantic == EEST_TextureFile) {
        std::__cxx11::string::_M_assign((string *)defaultTexture);
      }
      else if (pEVar16->eSemantic == EEST_Material) {
        pEVar22 = (pDVar11->alElementData).
                  super__Vector_base<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar18;
        pPVar15 = (pEVar16->alProperties).
                  super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        EVar10 = local_4e8._0_4_;
        if (pPVar15 ==
            (pEVar16->alProperties).
            super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_538 = 0xffffffff;
          local_53c._0_1_ = true;
          uVar14 = 0;
          EVar23 = EDT_Char;
        }
        else {
          local_50c = uStack_4c0._4_4_;
          local_508 = (EDataType)uStack_4c0;
          local_504 = local_4c8._4_4_;
          local_500 = local_4c8._0_4_;
          local_4fc = uStack_4d0._4_4_;
          local_524 = uStack_4a0;
          local_4f8 = (EDataType)uStack_4d0;
          local_520 = uStack_4a4;
          local_4f4 = local_4d8._4_4_;
          local_51c = local_4a8;
          local_4f0 = local_4d8._0_4_;
          local_518 = uStack_4ac;
          local_534 = local_4e8._12_4_;
          local_488 = CONCAT44(local_488._4_4_,uStack_4b4);
          local_514 = uStack_4b0;
          local_53c = local_4e8._4_4_;
          local_510 = local_4e8._8_4_;
          uVar21 = 0;
          local_538 = 0xffffffff;
          EVar23 = EDT_Char;
          uVar18 = 0xffffffff;
          uVar14 = 0;
          do {
            if (pPVar15->bIsList == false) {
              EVar1 = pPVar15->Semantic;
              if (EVar1 == EST_PhongPower) {
                uVar14 = (ulong)pPVar15->eType;
                local_538 = uVar21;
              }
              if (EVar1 == EST_Opacity) {
                EVar23 = pPVar15->eType;
                uVar18 = uVar21;
              }
              switch(EVar1) {
              case EST_AmbientRed:
                local_500 = pPVar15->eType;
                local_498 = uVar21;
                break;
              case EST_AmbientGreen:
                local_504 = pPVar15->eType;
                uStack_494 = uVar21;
                break;
              case EST_AmbientBlue:
                local_508 = pPVar15->eType;
                uStack_490 = uVar21;
                break;
              case EST_AmbientAlpha:
                local_50c = pPVar15->eType;
                uStack_48c = uVar21;
                break;
              case EST_DiffuseRed:
                EVar10 = pPVar15->eType;
                local_4b8 = uVar21;
                break;
              case EST_DiffuseGreen:
                local_53c = pPVar15->eType;
                local_488 = CONCAT44(local_488._4_4_,uVar21);
                break;
              case EST_DiffuseBlue:
                local_510 = pPVar15->eType;
                local_514 = uVar21;
                break;
              case EST_DiffuseAlpha:
                local_534 = pPVar15->eType;
                local_518 = uVar21;
                break;
              case EST_SpecularRed:
                local_4f0 = pPVar15->eType;
                local_51c = uVar21;
                break;
              case EST_SpecularGreen:
                local_4f4 = pPVar15->eType;
                local_520 = uVar21;
                break;
              case EST_SpecularBlue:
                local_4f8 = pPVar15->eType;
                local_524 = uVar21;
                break;
              case EST_SpecularAlpha:
                local_4fc = pPVar15->eType;
                uStack_49c = uVar21;
              }
            }
            pPVar15 = pPVar15 + 1;
            uVar21 = uVar21 + 1;
          } while (pPVar15 !=
                   (pEVar16->alProperties).
                   super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
          uStack_4c0._0_4_ = local_508;
          uStack_4c0._4_4_ = local_50c;
          local_4c8._4_4_ = local_504;
          local_4c8._0_4_ = local_500;
          uStack_4a0 = local_524;
          uStack_4d0._0_4_ = local_4f8;
          uStack_4d0._4_4_ = local_4fc;
          uStack_4a4 = local_520;
          local_4d8._4_4_ = local_4f4;
          local_4a8 = local_51c;
          local_4d8._0_4_ = local_4f0;
          uStack_4ac = local_518;
          uStack_4b0 = local_514;
          local_4e8._8_4_ = local_510;
          local_4e8._12_4_ = local_534;
          uStack_4b4 = (undefined4)local_488;
          auVar5._4_8_ = local_4e8._8_8_;
          auVar5._0_4_ = local_53c;
          auVar5._12_4_ = 0;
          local_4e8 = auVar5 << 0x20;
          defaultTexture = local_478;
          local_470 = pEVar22;
          local_53c._0_1_ = uVar18 == 0xffffffff;
        }
        local_4e8._0_4_ = EVar10;
        goto LAB_0047f308;
      }
      pEVar16 = pEVar16 + 1;
      uVar18 = uVar18 + 1;
      pDVar11 = this->pcDOM;
    } while (pEVar16 !=
             (pDVar11->alElements).
             super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>._M_impl
             .super__Vector_impl_data._M_finish);
    uVar14 = 0;
    EVar23 = EDT_Char;
    pEVar22 = (pointer)0x0;
  }
LAB_0047f308:
  if (pEVar22 == (pointer)0x0) {
    paVar12 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(paVar12);
    local_52c = 2;
    local_548 = paVar12;
    aiMaterial::AddBinaryProperty(paVar12,&local_52c,4,"$mat.shadingm",0,0,aiPTI_Integer);
    uVar8 = local_468._8_8_;
    local_468.r = 0.0;
    local_468.g = 1.0;
    local_468.r = 1.0;
    aVar7 = local_468;
    local_468.a = SUB84(uVar8,4);
    local_468._0_8_ = aVar7._0_8_;
    local_468.b = 1.0;
    aiMaterial::AddBinaryProperty(local_548,&local_468,0xc,"$clr.diffuse",0,0,aiPTI_Float);
    aiMaterial::AddBinaryProperty(local_548,&local_468,0xc,"$clr.specular",0,0,aiPTI_Float);
    local_468.b = 1.0;
    local_468.r = 1.0;
    local_468.g = 1.0;
    aiMaterial::AddBinaryProperty(local_548,&local_468,0xc,"$clr.ambient",0,0,aiPTI_Float);
    if ((char)local_530 == '\0') {
      local_438.length = 1;
      aiMaterial::AddBinaryProperty(local_548,&local_438,4,"$mat.twosided",0,0,aiPTI_Integer);
    }
    pvVar20 = local_480;
    if (defaultTexture->_M_string_length != 0) {
      std::__cxx11::string::string
                ((string *)&local_458,(defaultTexture->_M_dataplus)._M_p,(allocator *)&local_4ec);
      sVar19 = 0x3ff;
      if ((local_450 & 0xfffffc00) == 0) {
        sVar19 = local_450 & 0xffffffff;
      }
      local_438.length = (ai_uint32)sVar19;
      memcpy((void *)((long)&local_438 + 4),local_458,sVar19);
      *(undefined1 *)((long)&local_438 + sVar19 + 4) = 0;
      if (local_458 != local_448) {
        operator_delete(local_458);
      }
      aiMaterial::AddProperty(local_548,&local_438,"$tex.file",1,0);
    }
    if ((char)local_530 != '\0') {
      local_438.length = 1;
      aiMaterial::AddBinaryProperty(local_548,&local_438,4,"$mat.wireframe",0,0,aiPTI_Integer);
    }
    iVar4._M_current = *(aiMaterial ***)(pvVar20 + 8);
    if (iVar4._M_current == *(aiMaterial ***)(pvVar20 + 0x10)) {
      std::vector<aiMaterial*,std::allocator<aiMaterial*>>::_M_realloc_insert<aiMaterial*const&>
                (pvVar20,iVar4,&local_548);
    }
    else {
      *iVar4._M_current = local_548;
      *(long *)(pvVar20 + 8) = *(long *)(pvVar20 + 8) + 8;
    }
  }
  else {
    avList = *(pointer *)
              &(pEVar22->alInstances).
               super__Vector_base<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
               ._M_impl;
    if (avList != *(pointer *)
                   ((long)&(pEVar22->alInstances).
                           super__Vector_base<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
                           ._M_impl + 8)) {
      uVar17 = (ulong)(int)local_538;
      pvVar20 = local_480;
      local_534 = EVar23;
      local_488 = uVar14;
      do {
        local_468.r = 0.0;
        local_468.g = 0.0;
        local_468.b = 0.0;
        local_468.a = 0.0;
        paVar12 = (aiMaterial *)operator_new(0x10);
        aiMaterial::aiMaterial(paVar12);
        local_548 = paVar12;
        GetMaterialColor(&avList->alProperties,&local_4b8,(EDataType *)local_4e8,&local_468);
        aiMaterial::AddBinaryProperty(local_548,&local_468,0x10,"$clr.diffuse",0,0,aiPTI_Float);
        GetMaterialColor(&avList->alProperties,&local_4a8,(EDataType *)local_4d8,&local_468);
        aiMaterial::AddBinaryProperty(local_548,&local_468,0x10,"$clr.specular",0,0,aiPTI_Float);
        GetMaterialColor(&avList->alProperties,&local_498,(EDataType *)local_4c8,&local_468);
        aiMaterial::AddBinaryProperty(local_548,&local_468,0x10,"$clr.ambient",0,0,aiPTI_Float);
        psVar6 = local_478;
        local_52c = 2;
        if (local_538 != 0xffffffff) {
          pPVar2 = (avList->alProperties).
                   super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar14 = ((long)(avList->alProperties).
                          super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 3) *
                   -0x5555555555555555;
          if (uVar14 < uVar17 || uVar14 - uVar17 == 0) {
            prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_438._0_8_ = local_438.data + 0xc;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_438,"Invalid .ply file: Property index is out of range.","")
            ;
            std::runtime_error::runtime_error(prVar13,(string *)&local_438);
            *(undefined ***)prVar13 = &PTR__runtime_error_00900168;
            __cxa_throw(prVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          if ((uint)local_488 < 8) {
            dVar3 = **(double **)
                      &pPVar2[uVar17].avList.
                       super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
            ;
            fVar24 = SUB84(dVar3,0);
            switch(local_488 & 0xffffffff) {
            default:
              fVar24 = (float)(int)fVar24;
              break;
            case 1:
            case 3:
            case 5:
              fVar24 = (float)((ulong)dVar3 & 0xffffffff);
              break;
            case 6:
              break;
            case 7:
              fVar24 = (float)dVar3;
            }
          }
          else {
            fVar24 = 0.0;
          }
          local_438.length = (ai_uint32)fVar24;
          if ((fVar24 != 0.0) || (NAN(fVar24))) {
            local_438.length = (ai_uint32)(fVar24 * 15.0);
            aiMaterial::AddBinaryProperty(local_548,&local_438,4,"$mat.shininess",0,0,aiPTI_Float);
            local_52c = 3;
          }
        }
        aiMaterial::AddBinaryProperty(local_548,&local_52c,4,"$mat.shadingm",0,0,aiPTI_Integer);
        if ((undefined1)local_53c == '\0') {
          pPVar2 = (avList->alProperties).
                   super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar14 = ((long)(avList->alProperties).
                          super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 3) *
                   -0x5555555555555555;
          if (uVar14 < uVar17 || uVar14 - uVar17 == 0) {
            prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_438._0_8_ = local_438.data + 0xc;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_438,"Invalid .ply file: Property index is out of range.","")
            ;
            std::runtime_error::runtime_error(prVar13,(string *)&local_438);
            *(undefined ***)prVar13 = &PTR__runtime_error_00900168;
            __cxa_throw(prVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          if (local_534 < EDT_INVALID) {
            dVar3 = **(double **)
                      &pPVar2[uVar17].avList.
                       super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
            ;
            fVar24 = SUB84(dVar3,0);
            switch(local_534) {
            default:
              fVar24 = (float)(int)fVar24;
              break;
            case EDT_UChar:
            case EDT_UShort:
            case EDT_UInt:
              fVar24 = (float)((ulong)dVar3 & 0xffffffff);
              break;
            case EDT_Float:
              break;
            case EDT_Double:
              fVar24 = (float)dVar3;
            }
          }
          else {
            fVar24 = 0.0;
          }
          local_438.length = (ai_uint32)fVar24;
          aiMaterial::AddBinaryProperty(local_548,&local_438,4,"$mat.opacity",0,0,aiPTI_Float);
        }
        local_4ec = 1;
        aiMaterial::AddBinaryProperty(local_548,&local_4ec,4,"$mat.twosided",0,0,aiPTI_Integer);
        if (psVar6->_M_string_length != 0) {
          std::__cxx11::string::string((string *)&local_458,(psVar6->_M_dataplus)._M_p,&local_525);
          puVar9 = local_458;
          sVar19 = local_450 & 0xffffffff;
          if ((local_450 & 0xfffffc00) != 0) {
            sVar19 = 0x3ff;
          }
          local_438.length = (ai_uint32)sVar19;
          memcpy((void *)((long)&local_438 + 4),local_458,sVar19);
          *(undefined1 *)((long)&local_438 + sVar19 + 4) = 0;
          if (puVar9 != local_448) {
            operator_delete(puVar9);
          }
          aiMaterial::AddProperty(local_548,&local_438,"$tex.file",1,0);
          pvVar20 = local_480;
        }
        if ((char)local_530 == '\0') {
          pKey = "$mat.twosided";
        }
        else {
          pKey = "$mat.wireframe";
        }
        local_438.length = 1;
        aiMaterial::AddBinaryProperty(local_548,&local_438,4,pKey,0,0,aiPTI_Integer);
        iVar4._M_current = *(aiMaterial ***)(pvVar20 + 8);
        if (iVar4._M_current == *(aiMaterial ***)(pvVar20 + 0x10)) {
          std::vector<aiMaterial*,std::allocator<aiMaterial*>>::_M_realloc_insert<aiMaterial*const&>
                    (pvVar20,iVar4,&local_548);
        }
        else {
          *iVar4._M_current = local_548;
          *(long *)(pvVar20 + 8) = *(long *)(pvVar20 + 8) + 8;
        }
        avList = avList + 1;
      } while (avList != *(pointer *)
                          ((long)&(pEVar22->alInstances).
                                  super__Vector_base<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>
                                  ._M_impl + 8));
    }
  }
  return;
}

Assistant:

void PLYImporter::LoadMaterial(std::vector<aiMaterial*>* pvOut, std::string &defaultTexture, const bool pointsOnly)
{
  ai_assert(NULL != pvOut);

  // diffuse[4], specular[4], ambient[4]
  // rgba order
  unsigned int aaiPositions[3][4] = {

    { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF },
    { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF },
    { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF },
  };

  PLY::EDataType aaiTypes[3][4] = {
    { EDT_Char, EDT_Char, EDT_Char, EDT_Char },
    { EDT_Char, EDT_Char, EDT_Char, EDT_Char },
    { EDT_Char, EDT_Char, EDT_Char, EDT_Char }
  };
  PLY::ElementInstanceList* pcList = NULL;

  unsigned int iPhong = 0xFFFFFFFF;
  PLY::EDataType ePhong = EDT_Char;

  unsigned int iOpacity = 0xFFFFFFFF;
  PLY::EDataType eOpacity = EDT_Char;

  // search in the DOM for a vertex entry
  unsigned int _i = 0;
  for (std::vector<PLY::Element>::const_iterator i = this->pcDOM->alElements.begin();
    i != this->pcDOM->alElements.end(); ++i, ++_i)
  {
    if (PLY::EEST_Material == (*i).eSemantic)
    {
      pcList = &this->pcDOM->alElementData[_i];

      // now check whether which coordinate sets are available
      unsigned int _a = 0;
      for (std::vector<PLY::Property>::const_iterator
        a = (*i).alProperties.begin();
        a != (*i).alProperties.end(); ++a, ++_a)
      {
        if ((*a).bIsList)continue;

        // pohng specularity      -----------------------------------
        if (PLY::EST_PhongPower == (*a).Semantic)
        {
          iPhong = _a;
          ePhong = (*a).eType;
        }

        // general opacity        -----------------------------------
        if (PLY::EST_Opacity == (*a).Semantic)
        {
          iOpacity = _a;
          eOpacity = (*a).eType;
        }

        // diffuse color channels -----------------------------------
        if (PLY::EST_DiffuseRed == (*a).Semantic)
        {
          aaiPositions[0][0] = _a;
          aaiTypes[0][0] = (*a).eType;
        }
        else if (PLY::EST_DiffuseGreen == (*a).Semantic)
        {
          aaiPositions[0][1] = _a;
          aaiTypes[0][1] = (*a).eType;
        }
        else if (PLY::EST_DiffuseBlue == (*a).Semantic)
        {
          aaiPositions[0][2] = _a;
          aaiTypes[0][2] = (*a).eType;
        }
        else if (PLY::EST_DiffuseAlpha == (*a).Semantic)
        {
          aaiPositions[0][3] = _a;
          aaiTypes[0][3] = (*a).eType;
        }
        // specular color channels -----------------------------------
        else if (PLY::EST_SpecularRed == (*a).Semantic)
        {
          aaiPositions[1][0] = _a;
          aaiTypes[1][0] = (*a).eType;
        }
        else if (PLY::EST_SpecularGreen == (*a).Semantic)
        {
          aaiPositions[1][1] = _a;
          aaiTypes[1][1] = (*a).eType;
        }
        else if (PLY::EST_SpecularBlue == (*a).Semantic)
        {
          aaiPositions[1][2] = _a;
          aaiTypes[1][2] = (*a).eType;
        }
        else if (PLY::EST_SpecularAlpha == (*a).Semantic)
        {
          aaiPositions[1][3] = _a;
          aaiTypes[1][3] = (*a).eType;
        }
        // ambient color channels -----------------------------------
        else if (PLY::EST_AmbientRed == (*a).Semantic)
        {
          aaiPositions[2][0] = _a;
          aaiTypes[2][0] = (*a).eType;
        }
        else if (PLY::EST_AmbientGreen == (*a).Semantic)
        {
          aaiPositions[2][1] = _a;
          aaiTypes[2][1] = (*a).eType;
        }
        else if (PLY::EST_AmbientBlue == (*a).Semantic)
        {
          aaiPositions[2][2] = _a;
          aaiTypes[2][2] = (*a).eType;
        }
        else if (PLY::EST_AmbientAlpha == (*a).Semantic)
        {
          aaiPositions[2][3] = _a;
          aaiTypes[2][3] = (*a).eType;
        }
      }
      break;
    }
    else if (PLY::EEST_TextureFile == (*i).eSemantic)
    {
      defaultTexture = (*i).szName;
    }
  }
  // check whether we have a valid source for the material data
  if (NULL != pcList) {
    for (std::vector<ElementInstance>::const_iterator i = pcList->alInstances.begin(); i != pcList->alInstances.end(); ++i)  {
      aiColor4D clrOut;
      aiMaterial* pcHelper = new aiMaterial();

      // build the diffuse material color
      GetMaterialColor((*i).alProperties, aaiPositions[0], aaiTypes[0], &clrOut);
      pcHelper->AddProperty<aiColor4D>(&clrOut, 1, AI_MATKEY_COLOR_DIFFUSE);

      // build the specular material color
      GetMaterialColor((*i).alProperties, aaiPositions[1], aaiTypes[1], &clrOut);
      pcHelper->AddProperty<aiColor4D>(&clrOut, 1, AI_MATKEY_COLOR_SPECULAR);

      // build the ambient material color
      GetMaterialColor((*i).alProperties, aaiPositions[2], aaiTypes[2], &clrOut);
      pcHelper->AddProperty<aiColor4D>(&clrOut, 1, AI_MATKEY_COLOR_AMBIENT);

      // handle phong power and shading mode
      int iMode = (int)aiShadingMode_Gouraud;
      if (0xFFFFFFFF != iPhong)   {
        ai_real fSpec = PLY::PropertyInstance::ConvertTo<ai_real>(GetProperty((*i).alProperties, iPhong).avList.front(), ePhong);

        // if shininess is 0 (and the pow() calculation would therefore always
        // become 1, not depending on the angle), use gouraud lighting
        if (fSpec)  {
          // scale this with 15 ... hopefully this is correct
          fSpec *= 15;
          pcHelper->AddProperty<ai_real>(&fSpec, 1, AI_MATKEY_SHININESS);

          iMode = (int)aiShadingMode_Phong;
        }
      }
      pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

      // handle opacity
      if (0xFFFFFFFF != iOpacity) {
        ai_real fOpacity = PLY::PropertyInstance::ConvertTo<ai_real>(GetProperty((*i).alProperties, iPhong).avList.front(), eOpacity);
        pcHelper->AddProperty<ai_real>(&fOpacity, 1, AI_MATKEY_OPACITY);
      }

      // The face order is absolutely undefined for PLY, so we have to
      // use two-sided rendering to be sure it's ok.
      const int two_sided = 1;
      pcHelper->AddProperty(&two_sided, 1, AI_MATKEY_TWOSIDED);

      //default texture
      if (!defaultTexture.empty())
      {
        const aiString name(defaultTexture.c_str());
        pcHelper->AddProperty(&name, _AI_MATKEY_TEXTURE_BASE, aiTextureType_DIFFUSE, 0);
      }

      if (!pointsOnly)
      {
        const int two_sided = 1;
        pcHelper->AddProperty(&two_sided, 1, AI_MATKEY_TWOSIDED);
      }

      //set to wireframe, so when using this material info we can switch to points rendering
      if (pointsOnly)
      {
        const int wireframe = 1;
        pcHelper->AddProperty(&wireframe, 1, AI_MATKEY_ENABLE_WIREFRAME);
      }

      // add the newly created material instance to the list
      pvOut->push_back(pcHelper);
    }
  }
  else
  {
    // generate a default material
    aiMaterial* pcHelper = new aiMaterial();

    // fill in a default material
    int iMode = (int)aiShadingMode_Gouraud;
    pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

    //generate white material most 3D engine just multiply ambient / diffuse color with actual ambient / light color
    aiColor3D clr;
    clr.b = clr.g = clr.r = 1.0f;
    pcHelper->AddProperty<aiColor3D>(&clr, 1, AI_MATKEY_COLOR_DIFFUSE);
    pcHelper->AddProperty<aiColor3D>(&clr, 1, AI_MATKEY_COLOR_SPECULAR);

    clr.b = clr.g = clr.r = 1.0f;
    pcHelper->AddProperty<aiColor3D>(&clr, 1, AI_MATKEY_COLOR_AMBIENT);

    // The face order is absolutely undefined for PLY, so we have to
    // use two-sided rendering to be sure it's ok.
    if (!pointsOnly)
    {
      const int two_sided = 1;
      pcHelper->AddProperty(&two_sided, 1, AI_MATKEY_TWOSIDED);
    }

    //default texture
    if (!defaultTexture.empty())
    {
      const aiString name(defaultTexture.c_str());
      pcHelper->AddProperty(&name, _AI_MATKEY_TEXTURE_BASE, aiTextureType_DIFFUSE, 0);
    }

    //set to wireframe, so when using this material info we can switch to points rendering
    if (pointsOnly)
    {
      const int wireframe = 1;
      pcHelper->AddProperty(&wireframe, 1, AI_MATKEY_ENABLE_WIREFRAME);
    }

    pvOut->push_back(pcHelper);
  }
}